

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O3

int Fra_ImpCheckForNode(Fra_Man_t *p,Vec_Int_t *vImps,Aig_Obj_t *pNode,int Pos)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Aig_Obj_t *pNew;
  Aig_Obj_t *pOld;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  
  if (Pos < vImps->nSize) {
    uVar13 = (ulong)(uint)Pos;
    do {
      if (Pos < 0) goto LAB_0069df76;
      piVar1 = vImps->pArray;
      uVar10 = piVar1[uVar13];
      if (uVar10 != 0) {
        uVar9 = (int)uVar10 >> 0x10;
        uVar11 = uVar9;
        if ((int)uVar9 < (int)(uVar10 & 0xffff)) {
          uVar11 = uVar10 & 0xffff;
        }
        if ((int)uVar11 < pNode->Id) {
          __assert_fail("Max >= pNode->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                        ,0x204,"int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)"
                       );
        }
        if (pNode->Id < (int)uVar11) break;
        pVVar2 = p->pManAig->vObjs;
        uVar11 = pVVar2->nSize;
        if ((((int)uVar11 <= (int)(uVar10 & 0xffff)) || ((int)uVar9 < 0)) || (uVar11 <= uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar3 = pVVar2->pArray;
        pvVar4 = ppvVar3[(ushort)uVar10];
        pvVar5 = ppvVar3[uVar9];
        iVar8 = p->pPars->nFramesK;
        uVar6 = *(ulong *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x20) +
                          (long)(*(int *)(*(long *)((long)pvVar4 + 0x28) + 0x18) *
                                 *(int *)((long)pvVar4 + 0x24) + iVar8) * 8);
        uVar7 = *(ulong *)(*(long *)(*(long *)((long)pvVar5 + 0x28) + 0x20) +
                          (long)(*(int *)(*(long *)((long)pvVar5 + 0x28) + 0x18) *
                                 *(int *)((long)pvVar5 + 0x24) + iVar8) * 8);
        uVar11 = *(uint *)((long)pvVar4 + 0x18) >> 3 & 1;
        uVar12 = (uint)uVar6 & 1;
        uVar10 = uVar11 ^ uVar12;
        uVar9 = ((uint)uVar7 ^ *(uint *)((long)pvVar5 + 0x18) >> 3) & 1;
        pOld = (Aig_Obj_t *)(uVar6 & 0xfffffffffffffffe);
        pNew = (Aig_Obj_t *)(uVar7 & 0xfffffffffffffffe);
        if (pOld == pNew) {
          if ((uVar10 != uVar9) && (((*(uint *)&pOld->field_0x18 & 7) != 1 || (uVar11 == uVar12))))
          {
            p->pCla->fRefinement = 1;
            piVar1[uVar13] = 0;
          }
        }
        else {
          iVar8 = Fra_NodesAreImp(p,pOld,pNew,uVar10,uVar9);
          if (iVar8 != 1) {
            p->pCla->fRefinement = 1;
            if (iVar8 == 0) {
              Fra_SmlResimulate(p);
            }
            iVar8 = vImps->nSize;
            if (iVar8 <= (int)uVar13) {
LAB_0069df76:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vImps->pArray[uVar13] != 0) {
              puts("Fra_ImpCheckForNode(): Implication is not refined!");
              iVar8 = vImps->nSize;
            }
            if (iVar8 <= (int)uVar13) goto LAB_0069df76;
            if (vImps->pArray[uVar13] != 0) {
              __assert_fail("Vec_IntEntry(vImps, i) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraImp.c"
                            ,0x22e,
                            "int Fra_ImpCheckForNode(Fra_Man_t *, Vec_Int_t *, Aig_Obj_t *, int)");
            }
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < vImps->nSize);
  }
  else {
    uVar13 = (ulong)(uint)Pos;
  }
  return (int)uVar13;
}

Assistant:

int Fra_ImpCheckForNode( Fra_Man_t * p, Vec_Int_t * vImps, Aig_Obj_t * pNode, int Pos )
{
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int i, Imp, Left, Right, Max, RetValue;
    int fComplL, fComplR;
    Vec_IntForEachEntryStart( vImps, Imp, i, Pos )
    {
        if ( Imp == 0 )
            continue;
        Left = Fra_ImpLeft(Imp);
        Right = Fra_ImpRight(Imp);
        Max = Abc_MaxInt( Left, Right );
        assert( Max >= pNode->Id );
        if ( Max > pNode->Id )
            return i;
        // get the corresponding nodes
        pLeft  = Aig_ManObj( p->pManAig, Left );
        pRight = Aig_ManObj( p->pManAig, Right );
        // get the corresponding FRAIG nodes
        pLeftF  = Fra_ObjFraig( pLeft, p->pPars->nFramesK );
        pRightF = Fra_ObjFraig( pRight, p->pPars->nFramesK );
        // get the complemented attributes
        fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
        fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
        // check equality
        if ( Aig_Regular(pLeftF) == Aig_Regular(pRightF) )
        {
            if ( fComplL == fComplR ) // x => x  - always true
                continue;
            assert( fComplL != fComplR );
            // consider 4 possibilities:
            // NOT(1) => 1    or   0 => 1  - always true
            // 1 => NOT(1)    or   1 => 0  - never true
            // NOT(x) => x    or   x       - not always true
            // x => NOT(x)    or   NOT(x)  - not always true
            if ( Aig_ObjIsConst1(Aig_Regular(pLeftF)) && fComplL ) // proved implication
                continue;
            // disproved implication
            p->pCla->fRefinement = 1;
            Vec_IntWriteEntry( vImps, i, 0 );
            continue;
        }
        // check the implication 
        // - if true, a clause is added
        // - if false, a cex is simulated
        // make sure the implication is refined
        RetValue = Fra_NodesAreImp( p, Aig_Regular(pLeftF), Aig_Regular(pRightF), fComplL, fComplR );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vImps, i) != 0 )
                printf( "Fra_ImpCheckForNode(): Implication is not refined!\n" );
            assert( Vec_IntEntry(vImps, i) == 0 );
        }
    }
    return i;
}